

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void h_store_32_unpackhi(uint16_t **dst,ptrdiff_t stride,__m128i *row)

{
  uint16_t *puVar1;
  undefined8 uVar2;
  undefined8 local_d8;
  __m128i val;
  __m128i *row_local;
  ptrdiff_t stride_local;
  uint16_t **dst_local;
  undefined4 uStack_20;
  
  uVar2 = CONCAT44(*(undefined4 *)((long)*row + 0xc),uStack_20);
  puVar1 = *dst;
  *(undefined8 *)puVar1 = local_d8;
  *(undefined8 *)(puVar1 + 4) = uVar2;
  puVar1 = *dst;
  *(undefined8 *)(puVar1 + 8) = local_d8;
  *(undefined8 *)(puVar1 + 0xc) = uVar2;
  puVar1 = *dst;
  *(undefined8 *)(puVar1 + 0x10) = local_d8;
  *(undefined8 *)(puVar1 + 0x14) = uVar2;
  puVar1 = *dst;
  *(undefined8 *)(puVar1 + 0x18) = local_d8;
  *(undefined8 *)(puVar1 + 0x1c) = uVar2;
  *dst = *dst + stride;
  return;
}

Assistant:

static inline void h_store_32_unpackhi(uint16_t **dst, const ptrdiff_t stride,
                                       const __m128i *row) {
  const __m128i val = _mm_unpackhi_epi64(*row, *row);
  _mm_store_si128((__m128i *)(*dst), val);
  _mm_store_si128((__m128i *)(*dst + 8), val);
  _mm_store_si128((__m128i *)(*dst + 16), val);
  _mm_store_si128((__m128i *)(*dst + 24), val);
  *dst += stride;
}